

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O0

void aom_internal_error_copy(aom_internal_error_info *info,aom_internal_error_info *src)

{
  uint *in_RSI;
  aom_internal_error_info *in_RDI;
  
  if (in_RSI[1] == 0) {
    aom_internal_error(in_RDI,(aom_codec_err_t)(ulong)*in_RSI,(char *)0x0);
  }
  else {
    aom_internal_error(in_RDI,(aom_codec_err_t)(ulong)*in_RSI,"%s",in_RSI + 2);
  }
  return;
}

Assistant:

void aom_internal_error_copy(struct aom_internal_error_info *info,
                             const struct aom_internal_error_info *src) {
  assert(info != src);
  assert(!src->setjmp);

  if (!src->has_detail) {
    aom_internal_error(info, src->error_code, NULL);
  } else {
    aom_internal_error(info, src->error_code, "%s", src->detail);
  }
}